

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_event_wait(ma_event *pEvent)

{
  anon_union_96_2_0c88ee4f_for_ma_event_1 *paVar1;
  ma_bool32 mVar2;
  
  mVar2 = 0;
  if ((pEvent != (ma_event *)0x0) && (mVar2 = 0, pEvent->pContext != (ma_context *)0x0)) {
    paVar1 = &pEvent->field_1;
    (*(pEvent->pContext->field_22).posix.pthread_mutex_lock)(paVar1);
    if ((pEvent->field_1).posix.value == 0) {
      do {
        (*(pEvent->pContext->field_22).posix.pthread_cond_wait)
                  ((undefined1 *)((long)&pEvent->field_1 + 0x28),paVar1);
      } while ((pEvent->field_1).posix.value == 0);
    }
    (pEvent->field_1).posix.value = 0;
    (*(pEvent->pContext->field_22).posix.pthread_mutex_unlock)(paVar1);
    mVar2 = 1;
  }
  return mVar2;
}

Assistant:

MA_API ma_bool32 ma_event_wait(ma_event* pEvent)
{
    if (pEvent == NULL || pEvent->pContext == NULL) {
        return MA_FALSE;
    }

#ifdef MA_WIN32
    return ma_event_wait__win32(pEvent);
#endif
#ifdef MA_POSIX
    return ma_event_wait__posix(pEvent);
#endif
}